

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment_tree.hpp
# Opt level: O3

idx_t __thiscall
duckdb::SegmentTree<duckdb::ColumnSegment,_false>::GetSegmentIndex
          (SegmentTree<duckdb::ColumnSegment,_false> *this,SegmentLock *l,idx_t row_number)

{
  unsigned_long params;
  bool bVar1;
  InternalException *this_00;
  reference pvVar2;
  pointer pCVar3;
  idx_t max_depth;
  unsigned_long in_R8;
  unsigned_long in_R9;
  string *msg;
  idx_t segment_index;
  string error;
  string local_f8;
  idx_t local_d8;
  undefined1 *local_d0;
  long local_c8;
  undefined1 local_c0 [16];
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  Exception local_90;
  undefined1 local_80 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  bVar1 = TryGetSegmentIndex(this,l,row_number,&local_d8);
  if (!bVar1) {
    local_d0 = local_c0;
    local_c8 = 0;
    local_c0[0] = 0;
    local_90._0_8_ = local_80;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"Attempting to find row number \"%lld\" in %lld nodes\n","");
    Exception::ConstructMessage<unsigned_long,unsigned_long>
              (&local_f8,&local_90,(string *)row_number,
               (long)(this->nodes).
                     super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
                     .
                     super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->nodes).
                     super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
                     .
                     super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4,in_R8);
    ::std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    if ((undefined1 *)local_90._0_8_ != local_80) {
      operator_delete((void *)local_90._0_8_);
    }
    if ((this->nodes).
        super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
        .
        super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->nodes).
        super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
        .
        super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      msg = (string *)0x0;
      do {
        local_b0[0] = local_a0;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_b0,"Node %lld: Start %lld, Count %lld","");
        pvVar2 = vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_true>::operator[]
                           (&this->nodes,(size_type)msg);
        params = pvVar2->row_start;
        pvVar2 = vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_true>::operator[]
                           (&this->nodes,(size_type)msg);
        pCVar3 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                 ::operator->(&pvVar2->node);
        Exception::ConstructMessage<unsigned_long,unsigned_long,unsigned_long>
                  (&local_f8,(Exception *)local_b0,msg,params,
                   (pCVar3->super_SegmentBase<duckdb::ColumnSegment>).count.
                   super___atomic_base<unsigned_long>._M_i,in_R9);
        ::std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_f8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p);
        }
        if (local_b0[0] != local_a0) {
          operator_delete(local_b0[0]);
        }
        msg = (string *)((long)&(msg->_M_dataplus)._M_p + 1);
      } while (msg < (string *)
                     ((long)(this->nodes).
                            super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
                            .
                            super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->nodes).
                            super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
                            .
                            super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4));
    }
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"Could not find node in column segment tree!\n%s%s","");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    ::std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_d0,local_d0 + local_c8);
    Exception::GetStackTrace_abi_cxx11_(&local_50,(Exception *)0x78,max_depth);
    InternalException::InternalException<std::__cxx11::string,std::__cxx11::string>
              (this_00,&local_f8,&local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  return local_d8;
}

Assistant:

idx_t GetSegmentIndex(SegmentLock &l, idx_t row_number) {
		idx_t segment_index;
		if (TryGetSegmentIndex(l, row_number, segment_index)) {
			return segment_index;
		}
		string error;
		error = StringUtil::Format("Attempting to find row number \"%lld\" in %lld nodes\n", row_number, nodes.size());
		for (idx_t i = 0; i < nodes.size(); i++) {
			error += StringUtil::Format("Node %lld: Start %lld, Count %lld", i, nodes[i].row_start,
			                            nodes[i].node->count.load());
		}
		throw InternalException("Could not find node in column segment tree!\n%s%s", error, Exception::GetStackTrace());
	}